

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string * __thiscall
google::protobuf::Reflection::GetRepeatedString_abi_cxx11_
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  FieldDescriptor *in_RCX;
  Reflection *in_RSI;
  Reflection *in_RDI;
  char *in_stack_00000048;
  char *in_stack_00000050;
  undefined4 in_stack_00000058;
  CppType in_stack_0000005c;
  Descriptor *in_stack_00000060;
  FieldDescriptor *in_stack_00000068;
  Descriptor *in_stack_00000070;
  int in_stack_000000c8;
  int in_stack_000000cc;
  ExtensionSet *in_stack_000000d0;
  Message *in_stack_ffffffffffffffb8;
  int index_00;
  Reflection *message_00;
  
  message_00 = in_RDI;
  pDVar4 = FieldDescriptor::containing_type(in_RCX);
  if (pDVar4 != in_RSI->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000060,(FieldDescriptor *)CONCAT44(in_stack_0000005c,in_stack_00000058),
               in_stack_00000050,in_stack_00000048);
  }
  LVar2 = FieldDescriptor::label(in_RCX);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000060,(FieldDescriptor *)CONCAT44(in_stack_0000005c,in_stack_00000058),
               in_stack_00000050,in_stack_00000048);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x407011);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (in_stack_00000070,in_stack_00000068,(char *)in_stack_00000060,in_stack_0000005c);
  }
  bVar1 = FieldDescriptor::is_extension(in_RCX);
  if (bVar1) {
    GetExtensionSet(in_RDI,in_stack_ffffffffffffffb8);
    FieldDescriptor::number(in_RCX);
    psVar5 = internal::ExtensionSet::GetRepeatedString_abi_cxx11_
                       (in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
    std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
  }
  else {
    FieldDescriptor::options(in_RCX);
    index_00 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    FieldOptions::ctype((FieldOptions *)0x407091);
    pbVar6 = GetRepeatedPtrField<std::__cxx11::string>
                       (in_RSI,(Message *)message_00,(FieldDescriptor *)in_RDI,index_00);
    std::__cxx11::string::string((string *)in_RDI,(string *)pbVar6);
  }
  return (string *)message_00;
}

Assistant:

std::string Reflection::GetRepeatedString(const Message& message,
                                          const FieldDescriptor* field,
                                          int index) const {
  USAGE_CHECK_ALL(GetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        return GetRepeatedPtrField<std::string>(message, field, index);
    }
  }
}